

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * x509_new_null(void)

{
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  X509 *ret;
  
  ret = (X509 *)OPENSSL_zalloc(200);
  if (ret == (X509 *)0x0) {
    ret = (X509 *)0x0;
  }
  else {
    ret->references = 1;
    ret->ex_pathlen = -1;
    CRYPTO_new_ex_data((int)ret + 0x20,in_RSI,ad);
    CRYPTO_MUTEX_init(&ret->lock);
  }
  return ret;
}

Assistant:

static X509 *x509_new_null(void) {
  X509 *ret = reinterpret_cast<X509 *>(OPENSSL_zalloc(sizeof(X509)));
  if (ret == NULL) {
    return NULL;
  }

  ret->references = 1;
  ret->ex_pathlen = -1;
  CRYPTO_new_ex_data(&ret->ex_data);
  CRYPTO_MUTEX_init(&ret->lock);
  return ret;
}